

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSocketCommon.cpp
# Opt level: O2

ssize_t PosixSocketCommon::read(int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  sockaddr *in_RCX;
  double in_XMM0_Qa;
  socklen_t class_rfa_size_local;
  double local_28;
  
  local_28 = in_XMM0_Qa;
  bVar1 = isBlockingEnabled(__fd);
  if ((0.0 < local_28 && bVar1) && (iVar2 = doBlockingTimeout(__fd,1,local_28), iVar2 == 0)) {
    return 0;
  }
  sVar3 = recvfrom(__fd,__buf,__nbytes & 0xffffffff,0,in_RCX,&class_rfa_size_local);
  return sVar3;
}

Assistant:

int PosixSocketCommon::read(int          socket_fd,
                            char*        buffer,
                            unsigned int size,
                            double       class_ts_bt,
                            sockaddr*    class_rfa,
                            socklen_t    class_rfa_size)
{
    // Is a valid timeout set?
    if (isBlockingEnabled(socket_fd) && class_ts_bt > 0.0)
    {
        // Perform the blocking timeout and check if the POLLIN event occurred
        if (doBlockingTimeout(socket_fd, POLLIN, class_ts_bt) == 0)
        {
            // No data is ready to read, just return
            return 0;
        }
    }

    // Read data
    int ret = recvfrom(socket_fd, buffer, size, 0, class_rfa, &class_rfa_size);

#if defined DEBUG
    if (ret == -1)
    {
        perror("PosixSocketCommon::read");
    }
#endif

    return ret;
}